

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::Parser::~Parser(Parser *this)

{
  Namespace *this_00;
  bool bVar1;
  reference ppNVar2;
  __normal_iterator<flatbuffers::Namespace_**,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
  local_20;
  __normal_iterator<flatbuffers::Namespace_**,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
  local_18;
  iterator it;
  Parser *this_local;
  
  it._M_current = (Namespace **)this;
  local_18._M_current =
       (Namespace **)
       std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::begin
                 (&this->namespaces_);
  while( true ) {
    local_20._M_current =
         (Namespace **)
         std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::end
                   (&this->namespaces_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::Namespace_**,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppNVar2;
    if (this_00 != (Namespace *)0x0) {
      Namespace::~Namespace(this_00);
      operator_delete(this_00,0x20);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::Namespace_**,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
    ::operator++(&local_18);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->string_cache_);
  std::
  vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
  ::~vector(&this->field_stack_);
  std::__cxx11::string::~string((string *)&this->file_being_parsed_);
  IDLOptions::~IDLOptions(&this->opts);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map(&this->known_attributes_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->native_included_files_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
  ::~map(&this->files_included_per_file_);
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->included_files_);
  std::__cxx11::string::~string((string *)&this->file_extension_);
  std::__cxx11::string::~string((string *)&this->file_identifier_);
  flexbuffers::Builder::~Builder(&this->flex_builder_);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&this->builder_);
  std::__cxx11::string::~string((string *)&this->error_);
  std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::~vector
            (&this->namespaces_);
  SymbolTable<flatbuffers::ServiceDef>::~SymbolTable(&this->services_);
  SymbolTable<flatbuffers::EnumDef>::~SymbolTable(&this->enums_);
  SymbolTable<flatbuffers::StructDef>::~SymbolTable(&this->structs_);
  SymbolTable<flatbuffers::Type>::~SymbolTable(&this->types_);
  ParserState::~ParserState(&this->super_ParserState);
  return;
}

Assistant:

~Parser() {
    for (auto it = namespaces_.begin(); it != namespaces_.end(); ++it) {
      delete *it;
    }
  }